

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

uint llvm::dwarf::OperationVersion(LocationAtom Op)

{
  uint local_c;
  LocationAtom Op_local;
  
  switch(Op) {
  case DW_OP_addr:
    local_c = 2;
    break;
  default:
    local_c = 0;
    break;
  case DW_OP_deref:
    local_c = 2;
    break;
  case DW_OP_const1u:
    local_c = 2;
    break;
  case DW_OP_const1s:
    local_c = 2;
    break;
  case DW_OP_const2u:
    local_c = 2;
    break;
  case DW_OP_const2s:
    local_c = 2;
    break;
  case DW_OP_const4u:
    local_c = 2;
    break;
  case DW_OP_const4s:
    local_c = 2;
    break;
  case DW_OP_const8u:
    local_c = 2;
    break;
  case DW_OP_const8s:
    local_c = 2;
    break;
  case DW_OP_constu:
    local_c = 2;
    break;
  case DW_OP_consts:
    local_c = 2;
    break;
  case DW_OP_dup:
    local_c = 2;
    break;
  case DW_OP_drop:
    local_c = 2;
    break;
  case DW_OP_over:
    local_c = 2;
    break;
  case DW_OP_pick:
    local_c = 2;
    break;
  case DW_OP_swap:
    local_c = 2;
    break;
  case DW_OP_rot:
    local_c = 2;
    break;
  case DW_OP_xderef:
    local_c = 2;
    break;
  case DW_OP_abs:
    local_c = 2;
    break;
  case DW_OP_and:
    local_c = 2;
    break;
  case DW_OP_div:
    local_c = 2;
    break;
  case DW_OP_minus:
    local_c = 2;
    break;
  case DW_OP_mod:
    local_c = 2;
    break;
  case DW_OP_mul:
    local_c = 2;
    break;
  case DW_OP_neg:
    local_c = 2;
    break;
  case DW_OP_not:
    local_c = 2;
    break;
  case DW_OP_or:
    local_c = 2;
    break;
  case DW_OP_plus:
    local_c = 2;
    break;
  case DW_OP_plus_uconst:
    local_c = 2;
    break;
  case DW_OP_shl:
    local_c = 2;
    break;
  case DW_OP_shr:
    local_c = 2;
    break;
  case DW_OP_shra:
    local_c = 2;
    break;
  case DW_OP_xor:
    local_c = 2;
    break;
  case DW_OP_bra:
    local_c = 2;
    break;
  case DW_OP_eq:
    local_c = 2;
    break;
  case DW_OP_ge:
    local_c = 2;
    break;
  case DW_OP_gt:
    local_c = 2;
    break;
  case DW_OP_le:
    local_c = 2;
    break;
  case DW_OP_lt:
    local_c = 2;
    break;
  case DW_OP_ne:
    local_c = 2;
    break;
  case DW_OP_skip:
    local_c = 2;
    break;
  case DW_OP_lit0:
    local_c = 2;
    break;
  case DW_OP_lit1:
    local_c = 2;
    break;
  case DW_OP_lit2:
    local_c = 2;
    break;
  case DW_OP_lit3:
    local_c = 2;
    break;
  case DW_OP_lit4:
    local_c = 2;
    break;
  case DW_OP_lit5:
    local_c = 2;
    break;
  case DW_OP_lit6:
    local_c = 2;
    break;
  case DW_OP_lit7:
    local_c = 2;
    break;
  case DW_OP_lit8:
    local_c = 2;
    break;
  case DW_OP_lit9:
    local_c = 2;
    break;
  case DW_OP_lit10:
    local_c = 2;
    break;
  case DW_OP_lit11:
    local_c = 2;
    break;
  case DW_OP_lit12:
    local_c = 2;
    break;
  case DW_OP_lit13:
    local_c = 2;
    break;
  case DW_OP_lit14:
    local_c = 2;
    break;
  case DW_OP_lit15:
    local_c = 2;
    break;
  case DW_OP_lit16:
    local_c = 2;
    break;
  case DW_OP_lit17:
    local_c = 2;
    break;
  case DW_OP_lit18:
    local_c = 2;
    break;
  case DW_OP_lit19:
    local_c = 2;
    break;
  case DW_OP_lit20:
    local_c = 2;
    break;
  case DW_OP_lit21:
    local_c = 2;
    break;
  case DW_OP_lit22:
    local_c = 2;
    break;
  case DW_OP_lit23:
    local_c = 2;
    break;
  case DW_OP_lit24:
    local_c = 2;
    break;
  case DW_OP_lit25:
    local_c = 2;
    break;
  case DW_OP_lit26:
    local_c = 2;
    break;
  case DW_OP_lit27:
    local_c = 2;
    break;
  case DW_OP_lit28:
    local_c = 2;
    break;
  case DW_OP_lit29:
    local_c = 2;
    break;
  case DW_OP_lit30:
    local_c = 2;
    break;
  case DW_OP_lit31:
    local_c = 2;
    break;
  case DW_OP_reg0:
    local_c = 2;
    break;
  case DW_OP_reg1:
    local_c = 2;
    break;
  case DW_OP_reg2:
    local_c = 2;
    break;
  case DW_OP_reg3:
    local_c = 2;
    break;
  case DW_OP_reg4:
    local_c = 2;
    break;
  case DW_OP_reg5:
    local_c = 2;
    break;
  case DW_OP_reg6:
    local_c = 2;
    break;
  case DW_OP_reg7:
    local_c = 2;
    break;
  case DW_OP_reg8:
    local_c = 2;
    break;
  case DW_OP_reg9:
    local_c = 2;
    break;
  case DW_OP_reg10:
    local_c = 2;
    break;
  case DW_OP_reg11:
    local_c = 2;
    break;
  case DW_OP_reg12:
    local_c = 2;
    break;
  case DW_OP_reg13:
    local_c = 2;
    break;
  case DW_OP_reg14:
    local_c = 2;
    break;
  case DW_OP_reg15:
    local_c = 2;
    break;
  case DW_OP_reg16:
    local_c = 2;
    break;
  case DW_OP_reg17:
    local_c = 2;
    break;
  case DW_OP_reg18:
    local_c = 2;
    break;
  case DW_OP_reg19:
    local_c = 2;
    break;
  case DW_OP_reg20:
    local_c = 2;
    break;
  case DW_OP_reg21:
    local_c = 2;
    break;
  case DW_OP_reg22:
    local_c = 2;
    break;
  case DW_OP_reg23:
    local_c = 2;
    break;
  case DW_OP_reg24:
    local_c = 2;
    break;
  case DW_OP_reg25:
    local_c = 2;
    break;
  case DW_OP_reg26:
    local_c = 2;
    break;
  case DW_OP_reg27:
    local_c = 2;
    break;
  case DW_OP_reg28:
    local_c = 2;
    break;
  case DW_OP_reg29:
    local_c = 2;
    break;
  case DW_OP_reg30:
    local_c = 2;
    break;
  case DW_OP_reg31:
    local_c = 2;
    break;
  case DW_OP_breg0:
    local_c = 2;
    break;
  case DW_OP_breg1:
    local_c = 2;
    break;
  case DW_OP_breg2:
    local_c = 2;
    break;
  case DW_OP_breg3:
    local_c = 2;
    break;
  case DW_OP_breg4:
    local_c = 2;
    break;
  case DW_OP_breg5:
    local_c = 2;
    break;
  case DW_OP_breg6:
    local_c = 2;
    break;
  case DW_OP_breg7:
    local_c = 2;
    break;
  case DW_OP_breg8:
    local_c = 2;
    break;
  case DW_OP_breg9:
    local_c = 2;
    break;
  case DW_OP_breg10:
    local_c = 2;
    break;
  case DW_OP_breg11:
    local_c = 2;
    break;
  case DW_OP_breg12:
    local_c = 2;
    break;
  case DW_OP_breg13:
    local_c = 2;
    break;
  case DW_OP_breg14:
    local_c = 2;
    break;
  case DW_OP_breg15:
    local_c = 2;
    break;
  case DW_OP_breg16:
    local_c = 2;
    break;
  case DW_OP_breg17:
    local_c = 2;
    break;
  case DW_OP_breg18:
    local_c = 2;
    break;
  case DW_OP_breg19:
    local_c = 2;
    break;
  case DW_OP_breg20:
    local_c = 2;
    break;
  case DW_OP_breg21:
    local_c = 2;
    break;
  case DW_OP_breg22:
    local_c = 2;
    break;
  case DW_OP_breg23:
    local_c = 2;
    break;
  case DW_OP_breg24:
    local_c = 2;
    break;
  case DW_OP_breg25:
    local_c = 2;
    break;
  case DW_OP_breg26:
    local_c = 2;
    break;
  case DW_OP_breg27:
    local_c = 2;
    break;
  case DW_OP_breg28:
    local_c = 2;
    break;
  case DW_OP_breg29:
    local_c = 2;
    break;
  case DW_OP_breg30:
    local_c = 2;
    break;
  case DW_OP_breg31:
    local_c = 2;
    break;
  case DW_OP_regx:
    local_c = 2;
    break;
  case DW_OP_fbreg:
    local_c = 2;
    break;
  case DW_OP_bregx:
    local_c = 2;
    break;
  case DW_OP_piece:
    local_c = 2;
    break;
  case DW_OP_deref_size:
    local_c = 2;
    break;
  case DW_OP_xderef_size:
    local_c = 2;
    break;
  case DW_OP_nop:
    local_c = 2;
    break;
  case DW_OP_push_object_address:
    local_c = 3;
    break;
  case DW_OP_call2:
    local_c = 3;
    break;
  case DW_OP_call4:
    local_c = 3;
    break;
  case DW_OP_call_ref:
    local_c = 3;
    break;
  case DW_OP_form_tls_address:
    local_c = 3;
    break;
  case DW_OP_call_frame_cfa:
    local_c = 3;
    break;
  case DW_OP_bit_piece:
    local_c = 3;
    break;
  case DW_OP_implicit_value:
    local_c = 4;
    break;
  case DW_OP_stack_value:
    local_c = 4;
    break;
  case DW_OP_implicit_pointer:
    local_c = 5;
    break;
  case DW_OP_addrx:
    local_c = 5;
    break;
  case DW_OP_constx:
    local_c = 5;
    break;
  case DW_OP_entry_value:
    local_c = 5;
    break;
  case DW_OP_const_type:
    local_c = 5;
    break;
  case DW_OP_regval_type:
    local_c = 5;
    break;
  case DW_OP_deref_type:
    local_c = 5;
    break;
  case DW_OP_xderef_type:
    local_c = 5;
    break;
  case DW_OP_convert:
    local_c = 5;
    break;
  case DW_OP_reinterpret:
    local_c = 5;
    break;
  case DW_OP_GNU_push_tls_address:
    local_c = 0;
    break;
  case DW_OP_WASM_location:
    local_c = 0;
    break;
  case DW_OP_GNU_entry_value:
    local_c = 0;
    break;
  case DW_OP_GNU_addr_index:
    local_c = 0;
    break;
  case DW_OP_GNU_const_index:
    local_c = 0;
  }
  return local_c;
}

Assistant:

unsigned llvm::dwarf::OperationVersion(dwarf::LocationAtom Op) {
  switch (Op) {
  default:
    return 0;
#define HANDLE_DW_OP(ID, NAME, VERSION, VENDOR)                                \
  case DW_OP_##NAME:                                                           \
    return VERSION;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}